

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix3.hpp
# Opt level: O0

SquareMatrix3<double> * __thiscall
OpenMD::SquareMatrix3<double>::inverse(SquareMatrix3<double> *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double *pdVar5;
  SquareMatrix3<double> *in_RSI;
  RectMatrix<double,_3U,_3U> *in_RDI;
  RectMatrix<double,_3U,_3U> *this_00;
  RealType det;
  SquareMatrix3<double> *m;
  double in_stack_ffffffffffffff48;
  
  SquareMatrix3((SquareMatrix3<double> *)0x1feeae);
  determinant(in_RSI);
  this_00 = (RectMatrix<double,_3U,_3U> *)
            ((in_RSI->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1][1] *
             (in_RSI->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][2] -
            (in_RSI->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1][2] *
            (in_RSI->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][1]);
  pdVar5 = RectMatrix<double,_3U,_3U>::operator()(in_RDI,0,0);
  *pdVar5 = (double)this_00;
  dVar1 = (in_RSI->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1][0];
  dVar2 = (in_RSI->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1][2];
  dVar3 = (in_RSI->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][0];
  dVar4 = (in_RSI->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][2];
  pdVar5 = RectMatrix<double,_3U,_3U>::operator()(in_RDI,1,0);
  *pdVar5 = dVar2 * dVar3 - dVar1 * dVar4;
  dVar1 = (in_RSI->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][1];
  dVar2 = (in_RSI->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1][0];
  dVar3 = (in_RSI->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1][1];
  dVar4 = (in_RSI->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][0];
  pdVar5 = RectMatrix<double,_3U,_3U>::operator()(in_RDI,2,0);
  *pdVar5 = dVar2 * dVar1 - dVar3 * dVar4;
  dVar1 = (in_RSI->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][1];
  dVar2 = (in_RSI->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][1];
  dVar3 = (in_RSI->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][2];
  dVar4 = (in_RSI->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][2];
  pdVar5 = RectMatrix<double,_3U,_3U>::operator()(in_RDI,0,1);
  *pdVar5 = dVar1 * dVar3 - dVar4 * dVar2;
  dVar1 = (in_RSI->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][2];
  dVar2 = (in_RSI->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][0];
  dVar3 = (in_RSI->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][0];
  dVar4 = (in_RSI->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][2];
  pdVar5 = RectMatrix<double,_3U,_3U>::operator()(in_RDI,1,1);
  *pdVar5 = dVar1 * dVar3 - dVar2 * dVar4;
  dVar1 = (in_RSI->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][0];
  dVar2 = (in_RSI->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][0];
  dVar3 = (in_RSI->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][1];
  dVar4 = (in_RSI->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[2][1];
  pdVar5 = RectMatrix<double,_3U,_3U>::operator()(in_RDI,2,1);
  *pdVar5 = dVar1 * dVar3 - dVar4 * dVar2;
  dVar1 = (in_RSI->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1][2];
  dVar2 = (in_RSI->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][1];
  dVar3 = (in_RSI->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][2];
  dVar4 = (in_RSI->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1][1];
  pdVar5 = RectMatrix<double,_3U,_3U>::operator()(in_RDI,0,2);
  *pdVar5 = dVar2 * dVar1 - dVar3 * dVar4;
  dVar1 = (in_RSI->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][0];
  dVar2 = (in_RSI->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][2];
  dVar3 = (in_RSI->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1][0];
  dVar4 = (in_RSI->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1][2];
  pdVar5 = RectMatrix<double,_3U,_3U>::operator()(in_RDI,1,2);
  *pdVar5 = dVar2 * dVar3 - dVar1 * dVar4;
  dVar1 = (in_RSI->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1][1];
  dVar2 = (in_RSI->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][0];
  dVar3 = (in_RSI->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][1];
  dVar4 = (in_RSI->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[1][0];
  pdVar5 = RectMatrix<double,_3U,_3U>::operator()(in_RDI,2,2);
  *pdVar5 = dVar2 * dVar1 - dVar3 * dVar4;
  RectMatrix<double,_3U,_3U>::operator/=(this_00,in_stack_ffffffffffffff48);
  return (SquareMatrix3<double> *)in_RDI;
}

Assistant:

SquareMatrix3<Real> inverse() const {
      SquareMatrix3<Real> m;
      RealType det = determinant();
      m(0, 0)      = this->data_[1][1] * this->data_[2][2] -
                this->data_[1][2] * this->data_[2][1];
      m(1, 0) = this->data_[1][2] * this->data_[2][0] -
                this->data_[1][0] * this->data_[2][2];
      m(2, 0) = this->data_[1][0] * this->data_[2][1] -
                this->data_[1][1] * this->data_[2][0];
      m(0, 1) = this->data_[2][1] * this->data_[0][2] -
                this->data_[2][2] * this->data_[0][1];
      m(1, 1) = this->data_[2][2] * this->data_[0][0] -
                this->data_[2][0] * this->data_[0][2];
      m(2, 1) = this->data_[2][0] * this->data_[0][1] -
                this->data_[2][1] * this->data_[0][0];
      m(0, 2) = this->data_[0][1] * this->data_[1][2] -
                this->data_[0][2] * this->data_[1][1];
      m(1, 2) = this->data_[0][2] * this->data_[1][0] -
                this->data_[0][0] * this->data_[1][2];
      m(2, 2) = this->data_[0][0] * this->data_[1][1] -
                this->data_[0][1] * this->data_[1][0];
      m /= det;
      return m;
    }